

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

void textui_browse_knowledge(void)

{
  _Bool _Var1;
  wchar_t wVar2;
  ulong uVar3;
  long lVar4;
  wchar_t wVar5;
  size_t i;
  region_conflict knowledge_region;
  
  wVar2 = max_runes();
  knowledge_region.col = L'\0';
  knowledge_region.row = L'\0';
  knowledge_region.width = L'\xffffffff';
  knowledge_region.page_rows = main_knowledge_menu.count + L'\x02';
  if (main_knowledge_menu.irune < main_knowledge_menu.count) {
    i = 0;
    uVar3 = (ulong)(uint)wVar2;
    if (wVar2 < L'\x01') {
      uVar3 = i;
    }
    while (uVar3 != i) {
      _Var1 = player_knows_rune(player,i);
      wVar2 = L'\0';
      if ((_Var1) || (i = i + 1, (player->opts).opt[0x1a] == true)) goto LAB_001c8336;
    }
    wVar2 = L'\x01';
LAB_001c8336:
    main_knowledge_menu.actions[main_knowledge_menu.irune].flags = wVar2;
  }
  if (main_knowledge_menu.iartifact < main_knowledge_menu.count) {
    wVar2 = collect_known_artifacts((int *)0x0,0);
    main_knowledge_menu.actions[main_knowledge_menu.iartifact].flags = (uint)(wVar2 < L'\x01');
  }
  wVar2 = main_knowledge_menu.count;
  if (main_knowledge_menu.iego < main_knowledge_menu.count) {
    wVar5 = L'\0';
    lVar4 = 0;
    while ((ulong)z_info->e_max * 0x260 + 0x260 != lVar4 + 0x260) {
      if (((&e_info->everseen)[lVar4] != false) ||
         (lVar4 = lVar4 + 0x260, (player->opts).opt[0x1a] == true)) goto LAB_001c83f1;
    }
    wVar5 = L'\x01';
LAB_001c83f1:
    main_knowledge_menu.actions[main_knowledge_menu.iego].flags = wVar5;
  }
  if (main_knowledge_menu.imonster < wVar2) {
    wVar2 = count_known_monsters();
    main_knowledge_menu.actions[main_knowledge_menu.imonster].flags = (uint)(wVar2 < L'\x01');
    wVar2 = main_knowledge_menu.count;
  }
  lVar4 = (long)main_knowledge_menu.ishape;
  if (main_knowledge_menu.ishape < wVar2) {
    wVar2 = count_interesting_shapes();
    main_knowledge_menu.actions[lVar4].flags = (uint)(wVar2 < L'\x01');
  }
  screen_save();
  menu_layout((menu *)&main_knowledge_menu.m,(region *)&knowledge_region);
  clear_from(L'\0');
  menu_select((menu *)&main_knowledge_menu.m,0,false);
  screen_load();
  return;
}

Assistant:

void textui_browse_knowledge(void)
{
	int i, flag, rune_max = max_runes();
	region knowledge_region = { 0, 0, -1, 2 + main_knowledge_menu.count };

	/* Runes */
	if (main_knowledge_menu.irune < main_knowledge_menu.count) {
		flag = MN_ACT_GRAYED;
		for (i = 0; i < rune_max; i++) {
			if (player_knows_rune(player, i)
					|| OPT(player, cheat_xtra)) {
				flag = 0;
				break;
			}
		}
		main_knowledge_menu.actions[main_knowledge_menu.irune].flags =
			flag;
	}
		
	/* Artifacts */
	if (main_knowledge_menu.iartifact < main_knowledge_menu.count) {
		main_knowledge_menu.actions[main_knowledge_menu.iartifact].flags =
			(collect_known_artifacts(NULL, 0) > 0) ?
			0 : MN_ACT_GRAYED;
	}

	/* Ego items */
	if (main_knowledge_menu.iego < main_knowledge_menu.count) {
		flag = MN_ACT_GRAYED;
		for (i = 0; i < z_info->e_max; i++) {
			if (e_info[i].everseen || OPT(player, cheat_xtra)) {
				flag = 0;
				break;
			}
		}
		main_knowledge_menu.actions[main_knowledge_menu.iego].flags = flag;
	}

	/* Monsters */
	if (main_knowledge_menu.imonster < main_knowledge_menu.count) {
		main_knowledge_menu.actions[main_knowledge_menu.imonster].flags =
			(count_known_monsters() > 0) ? 0 : MN_ACT_GRAYED;
	}

	/* Shapechanges */
	if (main_knowledge_menu.ishape < main_knowledge_menu.count) {
		main_knowledge_menu.actions[main_knowledge_menu.ishape].flags =
			(count_interesting_shapes() > 0) ? 0 : MN_ACT_GRAYED;
	}

	screen_save();
	menu_layout(&main_knowledge_menu.m, &knowledge_region);

	clear_from(0);
	menu_select(&main_knowledge_menu.m, 0, false);

	screen_load();
}